

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O3

void __thiscall KalmanFilter::Predict(KalmanFilter *this)

{
  MatrixXd *pMVar1;
  MatrixXd *this_00;
  long nbCols;
  long nbRows;
  char *__function;
  MatrixXd Ft;
  ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_a0;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  local_60;
  PlainObject *local_38;
  MatrixXd *local_30;
  
  pMVar1 = &this->F_;
  local_a0.m_rhs = (RhsNested)&this->x_;
  local_a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  local_a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  local_a0.m_lhs = pMVar1;
  if ((this->F_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    _set_selector<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_a0.m_rhs,
               (GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
                *)&local_a0,(true_type *)&local_60);
    free(local_a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    nbCols = (this->F_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    nbRows = (this->F_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    local_a0.m_lhs = pMVar1;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_78,nbCols * nbRows,nbRows,nbCols);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_78,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_a0)
    ;
    this_00 = &this->P_;
    local_60.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_60.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_60.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    local_60.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_lhs = pMVar1;
    local_60.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_rhs = this_00;
    if ((this->F_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        == (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows) {
      Eigen::
      ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::ProductBase(&local_a0,&local_60,(Matrix<double,__1,__1,_0,__1,__1> *)&local_78);
      local_38 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_a0);
      local_30 = &this->Q_;
      if ((((local_a0.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_rows ==
           (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows) &&
         ((((MatrixXd *)((long)local_a0.m_rhs + 0x10))->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data ==
          (double *)
          (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_38);
        free(local_a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(local_60.
             super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_78.m_data);
        return;
      }
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/CwiseBinaryOp.h"
                    ,0x84,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, 5>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, 5>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    __function = 
    "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  else {
    __function = 
    "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/ProductBase.h"
                ,0x66,__function);
}

Assistant:

void KalmanFilter::Predict() {
  /**
  TODO:
    * predict the state  cheked
  */
  x_ = F_ * x_;
  MatrixXd Ft = F_.transpose();
  P_ = F_ * P_ * Ft + Q_;
}